

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O1

void __thiscall CUIRect::VSplitMid(CUIRect *this,CUIRect *pLeft,CUIRect *pRight,float Spacing)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  
  uVar3 = this->x;
  uVar4 = this->y;
  fVar1 = this->w;
  fVar2 = this->h;
  fVar6 = fVar1 * 0.5;
  fVar5 = Spacing * 0.5;
  if (pLeft != (CUIRect *)0x0) {
    pLeft->x = (float)uVar3;
    pLeft->y = (float)uVar4;
    pLeft->w = fVar6 - fVar5;
    pLeft->h = fVar2;
  }
  if (pRight != (CUIRect *)0x0) {
    pRight->x = (float)uVar3 + fVar6 + fVar5;
    pRight->y = (float)uVar4;
    pRight->w = (fVar1 - fVar6) - fVar5;
    pRight->h = fVar2;
  }
  return;
}

Assistant:

void CUIRect::VSplitMid(CUIRect *pLeft, CUIRect *pRight, float Spacing) const
{
	CUIRect r = *this;
	const float Cut = r.w/2;
	const float HalfSpacing = Spacing/2;

	if(pLeft)
	{
		pLeft->x = r.x;
		pLeft->y = r.y;
		pLeft->w = Cut - HalfSpacing;
		pLeft->h = r.h;
	}

	if(pRight)
	{
		pRight->x = r.x + Cut + HalfSpacing;
		pRight->y = r.y;
		pRight->w = r.w - Cut - HalfSpacing;
		pRight->h = r.h;
	}
}